

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O1

BadStatusOrAccess * __thiscall
absl::lts_20240722::BadStatusOrAccess::operator=(BadStatusOrAccess *this,BadStatusOrAccess *other)

{
  int *piVar1;
  int *piVar2;
  anon_class_8_1_8991fb9c *in_RDX;
  BadStatusOrAccess *local_18;
  
  local_18 = other;
  if ((other->init_what_).control_.super___atomic_base<unsigned_int>._M_i != 0xdd) {
    base_internal::CallOnceImpl<absl::lts_20240722::BadStatusOrAccess::InitWhat()const::__0>
              (&(other->init_what_).control_,(SchedulingMode)&local_18,in_RDX);
  }
  piVar1 = (int *)(this->status_).rep_;
  piVar2 = (int *)(other->status_).rep_;
  if (piVar2 != piVar1) {
    if (((ulong)piVar2 & 1) == 0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    (this->status_).rep_ = (other->status_).rep_;
    if (((ulong)piVar1 & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->what_);
  return this;
}

Assistant:

BadStatusOrAccess& BadStatusOrAccess::operator=(
    const BadStatusOrAccess& other) {
  // Ensure assignment is correct regardless of whether this->InitWhat() has
  // already been called.
  other.InitWhat();
  status_ = other.status_;
  what_ = other.what_;
  return *this;
}